

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t roaring64_bitmap_portable_size_in_bytes(roaring64_bitmap_t *r)

{
  art_val_t *paVar1;
  uint uVar2;
  size_t sVar3;
  roaring_array_t *ra;
  ulong uVar4;
  uint32_t cap;
  uint uVar5;
  size_t local_158;
  art_iterator_t it;
  art_iterator_t it2;
  
  art_init_iterator(&it,&r->art,true);
  local_158 = 8;
  ra = (roaring_array_t *)0x0;
  uVar2 = 0;
  while (paVar1 = it.value, it.value != (art_val_t *)0x0) {
    uVar4 = (ulong)(uint)it.key._0_4_;
    uVar4 = (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
            uVar4 << 0x38;
    uVar5 = (uint)(uVar4 >> 0x20);
    if ((ra == (roaring_array_t *)0x0) || (uVar2 != uVar5)) {
      if (ra != (roaring_array_t *)0x0) {
        sVar3 = ra_portable_size_in_bytes(ra);
        local_158 = local_158 + sVar3 + 4;
        roaring_bitmap_free_without_containers((roaring_bitmap_t *)ra);
      }
      memcpy(&it2,&it,0x90);
      cap = 0;
      while ((it2.value != (art_val_t *)0x0 &&
             (uVar5 == ((uint)it2.key._0_4_ >> 0x18 | (uint)it2.key._0_4_ >> 8 & 0xff00 |
                        (uint)((((ulong)(uint)it2.key._0_4_ & 0xff00) << 0x28) >> 0x20) |
                       (uint)(((ulong)(uint)it2.key._0_4_ << 0x38) >> 0x20))))) {
        cap = cap + 1;
        art_iterator_next(&it2);
      }
      ra = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
      uVar2 = uVar5;
    }
    ra_append(ra,(uint16_t)(uVar4 >> 0x30),r->containers[*paVar1 >> 8],(uint8_t)*paVar1);
    art_iterator_next(&it);
  }
  if (ra != (roaring_array_t *)0x0) {
    sVar3 = ra_portable_size_in_bytes(ra);
    local_158 = local_158 + sVar3 + 4;
    roaring_bitmap_free_without_containers((roaring_bitmap_t *)ra);
  }
  return local_158;
}

Assistant:

size_t roaring64_bitmap_portable_size_in_bytes(const roaring64_bitmap_t *r) {
    // https://github.com/RoaringBitmap/RoaringFormatSpec#extension-for-64-bit-implementations
    size_t size = 0;

    // Write as uint64 the distinct number of "buckets", where a bucket is
    // defined as the most significant 32 bits of an element.
    uint64_t high32_count;
    size += sizeof(high32_count);

    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    uint32_t prev_high32 = 0;
    roaring_bitmap_t *bitmap32 = NULL;

    // Iterate through buckets ordered by increasing keys.
    while (it.value != NULL) {
        uint32_t current_high32 = (uint32_t)(combine_key(it.key, 0) >> 32);
        if (bitmap32 == NULL || prev_high32 != current_high32) {
            if (bitmap32 != NULL) {
                // Write as uint32 the most significant 32 bits of the
                // bucket.
                size += sizeof(prev_high32);

                // Write the 32-bit Roaring bitmaps representing the least
                // significant bits of a set of elements.
                size += roaring_bitmap_portable_size_in_bytes(bitmap32);
                roaring_bitmap_free_without_containers(bitmap32);
            }

            // Start a new 32-bit bitmap with the current high 32 bits.
            art_iterator_t it2 = it;
            uint32_t containers_with_high32 = 0;
            while (it2.value != NULL && (uint32_t)(combine_key(it2.key, 0) >>
                                                   32) == current_high32) {
                containers_with_high32++;
                art_iterator_next(&it2);
            }
            bitmap32 =
                roaring_bitmap_create_with_capacity(containers_with_high32);

            prev_high32 = current_high32;
        }
        leaf_t leaf = (leaf_t)*it.value;
        ra_append(&bitmap32->high_low_container,
                  (uint16_t)(current_high32 >> 16), get_container(r, leaf),
                  get_typecode(leaf));
        art_iterator_next(&it);
    }

    if (bitmap32 != NULL) {
        // Write as uint32 the most significant 32 bits of the bucket.
        size += sizeof(prev_high32);

        // Write the 32-bit Roaring bitmaps representing the least
        // significant bits of a set of elements.
        size += roaring_bitmap_portable_size_in_bytes(bitmap32);
        roaring_bitmap_free_without_containers(bitmap32);
    }

    return size;
}